

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O3

int __thiscall ncnn::InnerProduct_x86::create_pipeline(InnerProduct_x86 *this,Option *opt)

{
  uint _h;
  _func_int **pp_Var1;
  size_t sVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int *piVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int _w;
  Layer *pLVar10;
  int iVar11;
  undefined4 *puVar12;
  ulong uVar13;
  void *pvVar14;
  _func_int *p_Var15;
  ulong uVar16;
  long lVar17;
  undefined4 *puVar18;
  undefined4 *puVar19;
  ParamDict pd;
  Mat local_78;
  
  pLVar10 = create_layer(0xe);
  this->flatten = pLVar10;
  ParamDict::ParamDict((ParamDict *)&local_78);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_78);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_78);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    iVar9 = cpu_support_x86_f16c();
    if ((iVar9 == 0) || (opt->use_fp16_storage != true)) {
      p_Var15 = this->_vptr_InnerProduct_x86[-3];
      _h = *(uint *)(&this->field_0xd0 + (long)p_Var15);
      iVar9 = *(int *)(&this->field_0xd8 + (long)p_Var15);
      uVar6 = (long)iVar9 / (long)(int)_h;
      if (((_h & 3) == 0) && (opt->use_packing_layout != false)) {
        _w = (int)uVar6;
        Mat::reshape(&local_78,(Mat *)(&this->field_0x130 + (long)p_Var15),_w,_h,(Allocator *)0x0);
        iVar9 = *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]);
        iVar11 = iVar9 + 3;
        if (-1 < iVar9) {
          iVar11 = iVar9;
        }
        Mat::create(&this->weight_data_tm,_w,iVar11 >> 2,0x10,4,(Allocator *)0x0);
        pp_Var1 = this->_vptr_InnerProduct_x86;
        p_Var15 = pp_Var1[-3];
        if (3 < *(int *)(&this->field_0xd0 + (long)p_Var15)) {
          iVar9 = (this->weight_data_tm).w;
          sVar2 = (this->weight_data_tm).elemsize;
          pvVar3 = (this->weight_data_tm).data;
          uVar13 = 0;
          puVar18 = (undefined4 *)local_78.data;
          do {
            if (0 < _w) {
              pvVar14 = (void *)((uVar13 >> 2 & 0x3fffffff) * (long)iVar9 * sVar2 + (long)pvVar3);
              uVar16 = 0;
              puVar12 = puVar18;
              do {
                lVar17 = 0;
                puVar19 = puVar12;
                do {
                  *(undefined4 *)((long)pvVar14 + lVar17) = *puVar19;
                  puVar19 = (undefined4 *)((long)puVar19 + (long)local_78.w * local_78.elemsize);
                  lVar17 = lVar17 + 4;
                } while (lVar17 != 0x10);
                uVar16 = uVar16 + 1;
                puVar12 = puVar12 + 1;
                pvVar14 = (void *)((long)pvVar14 + 0x10);
              } while (uVar16 != (uVar6 & 0xffffffff));
              p_Var15 = pp_Var1[-3];
            }
            lVar17 = uVar13 + 7;
            puVar18 = puVar18 + (long)local_78.w * local_78.elemsize;
            uVar13 = uVar13 + 4;
          } while (lVar17 < *(int *)(&this->field_0xd0 + (long)p_Var15));
        }
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + -1;
          UNLOCK();
          if (*local_78.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if ((undefined4 *)local_78.data != (undefined4 *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else if (p_Var15 != (_func_int *)0xfffffffffffffee0) {
        piVar5 = *(int **)(&this->field_0x138 + (long)p_Var15);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = (this->weight_data_tm).refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pvVar3 = (this->weight_data_tm).data;
            pAVar4 = (this->weight_data_tm).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])(pAVar4,pvVar3,(long)iVar9 % (long)(int)_h & 0xffffffff);
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        piVar5 = *(int **)((long)(&this->field_0x130 + (long)p_Var15) + 8);
        (this->weight_data_tm).data = *(void **)(&this->field_0x130 + (long)p_Var15);
        (this->weight_data_tm).refcount = piVar5;
        (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var15);
        (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var15);
        (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var15);
        uVar7 = *(undefined8 *)(&this->field_0x158 + (long)p_Var15);
        uVar8 = *(undefined8 *)((long)(&this->field_0x158 + (long)p_Var15) + 8);
        (this->weight_data_tm).dims = (int)uVar7;
        (this->weight_data_tm).w = (int)((ulong)uVar7 >> 0x20);
        (this->weight_data_tm).h = (int)uVar8;
        (this->weight_data_tm).d = (int)((ulong)uVar8 >> 0x20);
        (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var15);
        (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var15);
      }
      if (opt->lightmode == true) {
        p_Var15 = this->_vptr_InnerProduct_x86[-3];
        piVar5 = *(int **)(&this->field_0x138 + (long)p_Var15);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (*(long **)(&this->field_0x150 + (long)p_Var15) == (long *)0x0) {
              if (*(void **)(&this->field_0x130 + (long)p_Var15) != (void *)0x0) {
                free(*(void **)(&this->field_0x130 + (long)p_Var15));
              }
            }
            else {
              (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var15) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x170 + (long)p_Var15) = 0;
        *(undefined8 *)(&this->field_0x13c + (long)p_Var15) = 0;
        *(undefined8 *)(&this->field_0x144 + (long)p_Var15) = 0;
        *(undefined8 *)(&this->field_0x130 + (long)p_Var15) = 0;
        *(undefined8 *)(&this->field_0x138 + (long)p_Var15) = 0;
        *(undefined8 *)(&this->field_0x158 + (long)p_Var15) = 0;
        *(undefined8 *)(&this->field_0x160 + (long)p_Var15) = 0;
        *(undefined4 *)(&this->field_0x168 + (long)p_Var15) = 0;
      }
    }
    else {
      create_pipeline_fp16s(this,opt);
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_tm.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_tm.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }
    else
    {
        weight_data_tm = weight_data;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}